

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

char * ndiHexEncode(char *cp,void *data,int n)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  char *tcp;
  byte bVar5;
  
  if (0 < n) {
    uVar2 = 0;
    do {
      bVar5 = *(byte *)((long)data + uVar2) >> 4;
      bVar3 = *(byte *)((long)data + uVar2) & 0xf;
      bVar4 = bVar5 + 0x30;
      bVar1 = bVar3 + 0x30;
      bVar5 = bVar5 + 0x37;
      if (bVar4 < 0x3a) {
        bVar5 = bVar4;
      }
      bVar4 = bVar3 + 0x37;
      if (bVar1 < 0x3a) {
        bVar4 = bVar1;
      }
      cp[uVar2 * 2] = bVar5;
      cp[uVar2 * 2 + 1] = bVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return cp;
}

Assistant:

ndicapiExport char* ndiHexEncode(char* cp, const void* data, int n)
{
  const unsigned char* bdata;
  int i, c1, c2;
  unsigned int d;
  char* tcp;

  bdata = (const unsigned char*)data;
  tcp = cp;

  for (i = 0; i < n; i++)
  {
    d = bdata[i];
    c1 = (d & 0xf0) >> 4;
    c2 = (d & 0x0f);
    c1 += '0';
    c2 += '0';
    if (c1 > '9')
    {
      c1 += ('A' - '0' - 10);
    }
    if (c2 > '9')
    {
      c2 += ('A' - '0' - 10);
    }
    *tcp++ = c1;
    *tcp++ = c2;
  }

  return cp;
}